

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::ReplaceInterfaceVariableWithScalars
          (InterfaceVariableScalarReplacement *this,Instruction *interface_var,
          Instruction *interface_var_type,uint32_t location,uint32_t component,
          uint32_t extra_array_length)

{
  bool bVar1;
  StorageClass storage_class;
  uint32_t uVar2;
  NestedCompositeComponents scalar_interface_vars;
  uint32_t local_54;
  NestedCompositeComponents local_50;
  
  uVar2 = (interface_var->has_result_id_ & 1) + 1;
  if (interface_var->has_type_id_ == false) {
    uVar2 = (uint)interface_var->has_result_id_;
  }
  local_54 = location;
  storage_class = Instruction::GetSingleWordOperand(interface_var,uVar2);
  CreateScalarInterfaceVarsForReplacement
            (&local_50,this,interface_var_type,storage_class,extra_array_length);
  AddLocationAndComponentDecorations(this,&local_50,&local_54,component);
  uVar2 = 0;
  if (interface_var->has_result_id_ == true) {
    uVar2 = Instruction::GetSingleWordOperand(interface_var,(uint)interface_var->has_type_id_);
  }
  KillLocationAndComponentDecorations(this,uVar2);
  bVar1 = ReplaceInterfaceVarWith(this,interface_var,extra_array_length,&local_50);
  if (bVar1) {
    IRContext::KillInst((this->super_Pass).context_,interface_var);
  }
  std::
  vector<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>
  ::~vector(&local_50.nested_composite_components);
  return bVar1;
}

Assistant:

bool InterfaceVariableScalarReplacement::ReplaceInterfaceVariableWithScalars(
    Instruction* interface_var, Instruction* interface_var_type,
    uint32_t location, uint32_t component, uint32_t extra_array_length) {
  NestedCompositeComponents scalar_interface_vars =
      CreateScalarInterfaceVarsForReplacement(interface_var_type,
                                              GetStorageClass(interface_var),
                                              extra_array_length);

  AddLocationAndComponentDecorations(scalar_interface_vars, &location,
                                     component);
  KillLocationAndComponentDecorations(interface_var->result_id());

  if (!ReplaceInterfaceVarWith(interface_var, extra_array_length,
                               scalar_interface_vars)) {
    return false;
  }

  context()->KillInst(interface_var);
  return true;
}